

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::InitializeStaticSRBResources
          (PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *this,
          IShaderResourceBinding *pSRB)

{
  undefined *puVar1;
  bool bVar2;
  uint uVar3;
  Char *pCVar4;
  undefined8 uVar5;
  ShaderResourceCacheImplType *DstResourceCache;
  char (*in_R8) [3];
  ShaderResourceCacheImplType *ResourceCache;
  string msg_1;
  IPipelineResourceSignature *pSRBSignature;
  PipelineResourceSignatureImplType *pThisImpl;
  string _msg;
  ShaderResourceBindingImplType *pSRBImpl;
  undefined1 local_38 [8];
  string msg;
  IShaderResourceBinding *pSRB_local;
  PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._8_8_ = pSRB;
  if (pSRB == (IShaderResourceBinding *)0x0) {
    FormatString<char[21]>((string *)local_38,(char (*) [21])"SRB must not be null");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"InitializeStaticSRBResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x221);
    std::__cxx11::string::~string((string *)local_38);
  }
  _msg.field_2._8_8_ =
       (size_type)
       ClassPtrCast<Diligent::ShaderResourceBindingGLImpl,Diligent::IShaderResourceBinding>
                 (msg.field_2._8_8_);
  bVar2 = ShaderResourceBindingBase<Diligent::EngineGLImplTraits>::StaticResourcesInitialized
                    ((ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *)_msg.field_2._8_8_);
  if (bVar2) {
    FormatString<char[87]>
              ((string *)&pThisImpl,
               (char (*) [87])
               "Static resources have already been initialized in this shader resource binding object."
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar5 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(1,uVar5,0);
    }
    std::__cxx11::string::~string((string *)&pThisImpl);
  }
  else {
    msg_1.field_2._8_8_ =
         (size_type)
         ShaderResourceBindingBase<Diligent::EngineGLImplTraits>::GetPipelineResourceSignature
                   (_msg.field_2._8_8_);
    uVar3 = (*(((IPipelineResourceSignature *)msg_1.field_2._8_8_)->super_IDeviceObject).
              super_IObject._vptr_IObject[0xf])(msg_1.field_2._8_8_,this);
    if ((uVar3 & 1) == 0) {
      FormatString<char[68],char_const*,char[3]>
                ((string *)&ResourceCache,
                 (Diligent *)"Shader resource binding is not compatible with resource signature \'",
                 (char (*) [68])
                 &(this->
                  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                  ).m_Desc,(char **)"\'.",in_R8);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"InitializeStaticSRBResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                 ,0x22e);
      std::__cxx11::string::~string((string *)&ResourceCache);
    }
    DstResourceCache =
         ShaderResourceBindingBase<Diligent::EngineGLImplTraits>::GetResourceCache
                   ((ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *)_msg.field_2._8_8_);
    PipelineResourceSignatureGLImpl::CopyStaticResources
              ((PipelineResourceSignatureGLImpl *)this,DstResourceCache);
    ShaderResourceBindingBase<Diligent::EngineGLImplTraits>::SetStaticResourcesInitialized
              ((ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *)_msg.field_2._8_8_);
  }
  return;
}

Assistant:

InitializeStaticSRBResources(IShaderResourceBinding* pSRB) const override final
    {
        DEV_CHECK_ERR(pSRB != nullptr, "SRB must not be null");

        ShaderResourceBindingImplType* const pSRBImpl = ClassPtrCast<ShaderResourceBindingImplType>(pSRB);
        if (pSRBImpl->StaticResourcesInitialized())
        {
            LOG_WARNING_MESSAGE("Static resources have already been initialized in this shader resource binding object.");
            return;
        }

        const PipelineResourceSignatureImplType* const pThisImpl = static_cast<const PipelineResourceSignatureImplType*>(this);
#ifdef DILIGENT_DEVELOPMENT
        {
            const IPipelineResourceSignature* pSRBSignature = pSRBImpl->GetPipelineResourceSignature();
            DEV_CHECK_ERR(pSRBSignature->IsCompatibleWith(pThisImpl), "Shader resource binding is not compatible with resource signature '", pThisImpl->m_Desc.Name, "'.");
        }
#endif

        auto& ResourceCache = pSRBImpl->GetResourceCache();
        pThisImpl->CopyStaticResources(ResourceCache);

        pSRBImpl->SetStaticResourcesInitialized();
    }